

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgLinearSolvers.cpp
# Opt level: O2

void __thiscall
TasGrid::TasSparse::WaveletBasisMatrix::apply<false>(WaveletBasisMatrix *this,double *x,double *r)

{
  pointer piVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  double dVar5;
  
  piVar1 = (this->pntr).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar3 = 0;
  uVar2 = (ulong)(uint)this->num_rows;
  if (this->num_rows < 1) {
    uVar2 = uVar3;
  }
  while (uVar3 != uVar2) {
    dVar5 = 0.0;
    for (lVar4 = (long)piVar1[uVar3]; lVar4 < piVar1[uVar3 + 1]; lVar4 = lVar4 + 1) {
      dVar5 = dVar5 + (this->vals).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar4] *
                      x[(this->indx).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start[lVar4]];
    }
    r[uVar3] = dVar5;
    uVar3 = uVar3 + 1;
  }
  return;
}

Assistant:

void WaveletBasisMatrix::apply(double const x[], double r[]) const{
    if (transpose){
        std::fill_n(r, num_rows, 0.0);
        for(int i=0; i<num_rows; i++){
            for(int j=pntr[i]; j<pntr[i+1]; j++)
                r[indx[j]] += vals[j] * x[i];
        }
    }else{
        for(int i=0; i<num_rows; i++){
            double sum = 0.0;
            for(int j=pntr[i]; j<pntr[i+1]; j++)
                sum += vals[j] * x[indx[j]];
            r[i] = sum;
        }
    }
}